

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O2

logical pnga_update44_ghosts(Integer g_a)

{
  char *pcVar1;
  short sVar2;
  int iVar3;
  ushort uVar4;
  int _d;
  uint uVar5;
  Integer proc;
  logical lVar6;
  long lVar7;
  Integer *map;
  ulong *puVar8;
  long lVar9;
  long lVar10;
  size_t sVar11;
  Integer IVar12;
  long lVar13;
  long lVar14;
  Integer IVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  ushort uVar20;
  long ndim;
  long lVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  ulong *proclist;
  int iVar26;
  int iVar27;
  long lVar28;
  int iVar29;
  int iVar30;
  long lVar31;
  char *pcVar32;
  ulong uVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  int local_6f8;
  int msglen;
  long local_6e8;
  char *local_6e0;
  ulong local_6d8;
  char *local_6d0;
  ulong local_6c8;
  long local_6c0;
  long local_6b8;
  char *local_6b0;
  ulong local_6a8;
  ulong local_6a0;
  ulong *local_698;
  long local_690;
  int local_684;
  long local_680;
  long local_678;
  long local_670;
  long local_668;
  ulong local_660;
  int _index [7];
  Integer _hi [7];
  Integer np;
  long local_5b0;
  long local_5a8;
  Integer local_5a0;
  int count [7];
  Integer shi_rcv [7];
  Integer slo_rcv [7];
  int stride_rcv [7];
  int stride_snd [7];
  char err_string [256];
  Integer hi_loc [7];
  Integer lo_loc [7];
  Integer index [7];
  Integer plo_rcv [7];
  Integer plo_snd [7];
  Integer width [7];
  Integer ld_loc [7];
  Integer phi_rcv [7];
  Integer phi_snd [7];
  Integer hi_rcv [7];
  Integer lo_rcv [7];
  Integer dims [7];
  Integer increment [7];
  char rcv_name [32];
  char send_name [32];
  
  proc = pnga_nodeid();
  lVar6 = pnga_has_ghosts(g_a);
  if (lVar6 != 0) {
    lVar36 = g_a + 1000;
    local_6e8 = lVar36 * 0x368;
    local_660 = (ulong)(uint)GA[lVar36].elemsize;
    sVar2 = GA[lVar36].ndim;
    ndim = (long)sVar2;
    iVar3 = GA[lVar36].p_handle;
    lVar7 = 0;
    lVar36 = 0;
    if (0 < ndim) {
      lVar36 = ndim;
    }
    local_690 = g_a * 0x368;
    for (; lVar36 != lVar7; lVar7 = lVar7 + 1) {
      increment[lVar7] = 0;
      width[lVar7] = GA[g_a + 1000].width[lVar7];
      dims[lVar7] = GA[g_a + 1000].dims[lVar7];
    }
    lVar6 = gai_check_ghost_distr(g_a);
    IVar12 = GAnproc;
    if (lVar6 == 0) {
      return 0;
    }
    map = (Integer *)malloc(GAnproc * 0x70 | 8);
    if (map == (Integer *)0x0) {
      pnga_error("pnga_update44_ghosts:malloc failed (_ga_map)",0);
      IVar12 = GAnproc;
    }
    puVar8 = (ulong *)malloc(IVar12 << 3);
    if (puVar8 == (ulong *)0x0) {
      pnga_error("pnga_update44_ghosts:malloc failed (_ga_proclist)",0);
    }
    pnga_distribution(g_a,proc,lo_loc,hi_loc);
    pnga_proc_topology(g_a,proc,index);
    lVar35 = local_6e8;
    lVar7 = 1;
    for (lVar9 = 0; lVar36 != lVar9; lVar9 = lVar9 + 1) {
      lVar7 = lVar7 * ((hi_loc[lVar9] - lo_loc[lVar9]) + width[lVar9] * 2 + 1);
    }
    IVar12 = 1;
    for (lVar9 = 0; lVar36 != lVar9; lVar9 = lVar9 + 1) {
      lVar10 = (lVar7 / ((hi_loc[lVar9] - lo_loc[lVar9]) + width[lVar9] * 2 + 1)) * width[lVar9];
      if (IVar12 <= lVar10) {
        IVar12 = lVar10;
      }
    }
    builtin_strncpy(send_name,"send_buffer",0xc);
    builtin_strncpy(rcv_name,"receive_buffer",0xf);
    local_698 = puVar8;
    local_6d0 = (char *)pnga_malloc(IVar12,*(int *)((long)GA->dims + local_6e8 + -0x2c),send_name);
    puVar8 = local_698;
    local_6e0 = (char *)pnga_malloc(IVar12,*(int *)((long)GA->dims + lVar35 + -0x2c),rcv_name);
    lVar7 = local_690;
    local_6f8 = (int)proc;
    local_670 = (long)local_6f8;
    local_684 = sVar2 + -1;
    local_6a8 = (ulong)(uint)((int)IVar12 * (int)local_660);
    lVar35 = 1;
    if (1 < ndim) {
      lVar35 = ndim;
    }
    local_678 = local_690 + 0xd50a8;
    lVar9 = local_690 + 0xd5068;
    local_680 = local_690 + 0xd4ee0;
    local_5b0 = local_690 + 0xd4f00;
    lVar10 = 0;
    local_6b8 = 0;
    local_5a0 = g_a;
    local_5a8 = lVar35 + -1;
    for (lVar35 = 0; lVar35 != lVar36; lVar35 = lVar35 + 1) {
      if (width[lVar35] != 0) {
        local_668 = width[lVar35];
        get_remote_block_neg(lVar35,ndim,lo_loc,hi_loc,slo_rcv,shi_rcv,dims,width);
        lVar6 = pnga_locate_region(g_a,slo_rcv,shi_rcv,map,(Integer *)puVar8,&np);
        if (lVar6 == 0) {
          builtin_strncpy(err_string,"cannot locate region: ",0x17);
          strcpy(err_string + 0x16,GA->name + local_6e8);
          sVar11 = strlen(err_string);
          sprintf(err_string + (int)sVar11," [%ld:%ld ",slo_rcv[0],shi_rcv[0]);
          sVar11 = strlen(err_string);
          lVar34 = 1;
          while( true ) {
            IVar12 = pnga_ndim(g_a);
            pcVar32 = err_string + (int)sVar11;
            if (IVar12 <= lVar34) break;
            sprintf(pcVar32,",%ld:%ld ",slo_rcv[lVar34],shi_rcv[lVar34]);
            sVar11 = strlen(err_string);
            lVar34 = lVar34 + 1;
          }
          pcVar32[0] = ']';
          pcVar32[1] = '\0';
          pnga_error(err_string,g_a);
          puVar8 = local_698;
        }
        lVar34 = local_668;
        local_6a0 = *puVar8;
        if (-1 < iVar3) {
          local_6a0 = (ulong)PGRP_LIST[iVar3].inv_map_proc_list[local_6a0];
        }
        for (lVar13 = 0; lVar36 != lVar13; lVar13 = lVar13 + 1) {
          if (lVar35 == lVar13) {
            lVar31 = local_668 + hi_loc[lVar35];
            lVar17 = hi_loc[lVar35] + 1;
          }
          else {
            lVar17 = lo_loc[lVar13];
            lVar31 = hi_loc[lVar13];
          }
          lo_rcv[lVar13] = lVar17;
          hi_rcv[lVar13] = lVar31;
        }
        for (lVar13 = 0; lVar36 != lVar13; lVar13 = lVar13 + 1) {
          if (lVar35 == lVar13) {
            if (dims[lVar35] < hi_rcv[lVar35]) {
              slo_rcv[lVar35] = 1;
              shi_rcv[lVar35] = local_668;
            }
            else {
              slo_rcv[lVar35] = lo_rcv[lVar35];
              shi_rcv[lVar35] = hi_rcv[lVar35];
            }
          }
          else {
            slo_rcv[lVar13] = lo_rcv[lVar13];
            shi_rcv[lVar13] = hi_rcv[lVar13];
          }
        }
        lVar6 = pnga_locate_region(g_a,slo_rcv,shi_rcv,map,(Integer *)puVar8,&np);
        if (lVar6 == 0) {
          builtin_strncpy(err_string,"cannot locate region: ",0x17);
          strcpy(err_string + 0x16,GA->name + local_6e8);
          sVar11 = strlen(err_string);
          sprintf(err_string + (int)sVar11," [%ld:%ld ",slo_rcv[0],shi_rcv[0]);
          sVar11 = strlen(err_string);
          lVar34 = 1;
          while( true ) {
            IVar12 = pnga_ndim(g_a);
            pcVar32 = err_string + (int)sVar11;
            if (IVar12 <= lVar34) break;
            sprintf(pcVar32,",%ld:%ld ",slo_rcv[lVar34],shi_rcv[lVar34]);
            sVar11 = strlen(err_string);
            lVar34 = lVar34 + 1;
          }
          pcVar32[0] = ']';
          pcVar32[1] = '\0';
          pnga_error(err_string,g_a);
          lVar34 = local_668;
          puVar8 = local_698;
        }
        pcVar32 = local_6d0;
        local_6c8 = *puVar8;
        if (-1 < iVar3) {
          local_6c8 = (ulong)(uint)PGRP_LIST[iVar3].inv_map_proc_list[local_6c8];
        }
        for (lVar13 = 0; lVar36 * 8 != lVar13; lVar13 = lVar13 + 8) {
          if (*(long *)((long)increment + lVar13) == 0) {
            if (lVar10 == lVar13) {
              plo_snd[lVar35] = lVar34;
              phi_snd[lVar35] = lVar34 * 2 + -1;
              plo_rcv[lVar35] = lVar34 + 1 + (hi_loc[lVar35] - lo_loc[lVar35]);
              phi_rcv[lVar35] = (hi_loc[lVar35] - lo_loc[lVar35]) + lVar34 * 2;
            }
            else {
              lVar31 = *(long *)((long)width + lVar13);
              *(long *)((long)plo_snd + lVar13) = lVar31;
              lVar17 = (*(long *)((long)hi_loc + lVar13) - *(long *)((long)lo_loc + lVar13)) +
                       lVar31;
              *(long *)((long)phi_snd + lVar13) = lVar17;
              *(long *)((long)plo_rcv + lVar13) = lVar31;
              *(long *)((long)phi_rcv + lVar13) = lVar17;
            }
          }
          else {
            *(undefined8 *)((long)plo_rcv + lVar13) = 0;
            lVar31 = (*(long *)((long)hi_loc + lVar13) - *(long *)((long)lo_loc + lVar13)) +
                     *(long *)((long)increment + lVar13);
            *(long *)((long)phi_rcv + lVar13) = lVar31;
            *(undefined8 *)((long)plo_snd + lVar13) = 0;
            *(long *)((long)phi_snd + lVar13) = lVar31;
          }
        }
        pcVar1 = (char *)((long)GA->dims + local_6e8 + -0x30);
        uVar20 = *(ushort *)((long)GA->dims + local_6e8 + -0x30);
        local_6d8 = (ulong)(short)uVar20;
        iVar27 = *(int *)((long)GA->block_dims + local_6e8 + -4);
        if (iVar27 - 1U < 3) {
          lVar13 = local_670 % *(long *)(pcVar1 + 0x260);
          _index[0] = (int)lVar13;
          IVar12 = proc;
          lVar34 = 0;
          while (lVar34 + 1 < (long)local_6d8) {
            IVar12 = (long)((int)IVar12 - (int)lVar13) /
                     *(long *)((long)GA->dims + lVar34 * 8 + local_678 + -0x38);
            lVar13 = (long)(int)IVar12 % *(long *)((long)GA->dims + lVar34 * 8 + local_678 + -0x30);
            _index[lVar34 + 1] = (int)lVar13;
            lVar34 = lVar34 + 1;
          }
          uVar4 = 0;
          if (0 < (short)uVar20) {
            uVar4 = uVar20;
          }
          for (lVar34 = 0; (ulong)uVar4 * 4 != lVar34; lVar34 = lVar34 + 4) {
            iVar29 = *(int *)((long)_index + lVar34);
            lVar13 = *(long *)((long)GA[1000].block_dims + lVar34 * 2 + lVar9 + -0xd5068);
            *(long *)(err_string + lVar34 * 2) = lVar13 * iVar29 + 1;
            lVar13 = ((long)iVar29 + 1) * lVar13;
            lVar31 = *(long *)((long)GA[1000].dims + lVar34 * 2 + lVar7);
            if (lVar31 <= lVar13) {
              lVar13 = lVar31;
            }
            *(long *)((long)_hi + lVar34 * 2) = lVar13;
          }
        }
        else if (iVar27 == 4) {
          lVar13 = local_670 % *(long *)(pcVar1 + 0x260);
          _index[0] = (int)lVar13;
          IVar12 = proc;
          lVar34 = 0;
          while (lVar34 + 1 < (long)local_6d8) {
            IVar12 = (long)((int)IVar12 - (int)lVar13) /
                     *(long *)((long)GA->dims + lVar34 * 8 + local_678 + -0x38);
            lVar13 = (long)(int)IVar12 % *(long *)((long)GA->dims + lVar34 * 8 + local_678 + -0x30);
            _index[lVar34 + 1] = (int)lVar13;
            lVar34 = lVar34 + 1;
          }
          lVar34 = 0;
          uVar4 = 0;
          if (0 < (short)uVar20) {
            uVar4 = uVar20;
          }
          iVar29 = 0;
          for (; (ulong)uVar4 * 4 != lVar34; lVar34 = lVar34 + 4) {
            lVar13 = *(long *)(GA->name + local_6e8 + -8);
            iVar26 = *(int *)((long)_index + lVar34);
            lVar17 = (long)iVar29 + (long)iVar26;
            *(undefined8 *)(err_string + lVar34 * 2) = *(undefined8 *)(lVar13 + lVar17 * 8);
            lVar31 = *(long *)(pcVar1 + lVar34 * 2 + 0x260);
            if ((long)iVar26 < lVar31 + -1) {
              lVar13 = *(long *)(lVar13 + 8 + lVar17 * 8) + -1;
            }
            else {
              lVar13 = *(long *)(pcVar1 + lVar34 * 2 + 0x30);
            }
            *(long *)((long)_hi + lVar34 * 2) = lVar13;
            iVar29 = iVar29 + (int)lVar31;
          }
        }
        else if (iVar27 == 0) {
          if (*(long *)(pcVar1 + 0x2a8) == 0) {
            uVar24 = 0;
            if (0 < (long)local_6d8) {
              uVar24 = local_6d8;
            }
            lVar34 = 1;
            for (uVar19 = 0; uVar24 != uVar19; uVar19 = uVar19 + 1) {
              lVar34 = lVar34 * *(int *)((long)GA->dims + uVar19 * 4 + local_680 + -0x30);
            }
            if ((proc < 0) || (lVar34 <= proc)) {
              for (uVar19 = 0; uVar24 != uVar19; uVar19 = uVar19 + 1) {
                hi_loc[uVar19 - 0x20] = 0;
                _hi[uVar19] = -1;
              }
            }
            else {
              lVar34 = 0;
              IVar12 = proc;
              for (uVar19 = 0; uVar24 != uVar19; uVar19 = uVar19 + 1) {
                lVar13 = (long)*(int *)((long)GA[1000].nblock + uVar19 * 4 + local_690);
                lVar31 = (IVar12 % lVar13) * 8 + *(long *)(pcVar1 + 0x1e8);
                hi_loc[uVar19 - 0x20] = *(Integer *)(lVar31 + lVar34 * 8);
                if (IVar12 % lVar13 == lVar13 + -1) {
                  lVar31 = *(long *)((long)GA[1000].dims + uVar19 * 8 + local_690);
                }
                else {
                  lVar31 = *(long *)(lVar31 + 8 + lVar34 * 8) + -1;
                }
                lVar34 = lVar34 + lVar13;
                _hi[uVar19] = lVar31;
                IVar12 = IVar12 / lVar13;
              }
            }
          }
          else if (proc < *(long *)(pcVar1 + 0x2a8)) {
            uVar24 = 0;
            if (0 < (long)local_6d8) {
              uVar24 = local_6d8;
            }
            lVar34 = 1;
            for (uVar19 = 0; uVar24 != uVar19; uVar19 = uVar19 + 1) {
              lVar34 = lVar34 * *(int *)((long)GA->dims + uVar19 * 4 + local_680 + -0x30);
            }
            if ((proc < 0) || (lVar34 <= proc)) {
              for (uVar19 = 0; uVar24 != uVar19; uVar19 = uVar19 + 1) {
                hi_loc[uVar19 - 0x20] = 0;
                _hi[uVar19] = -1;
              }
            }
            else {
              lVar34 = 0;
              IVar12 = proc;
              for (uVar19 = 0; uVar24 != uVar19; uVar19 = uVar19 + 1) {
                lVar13 = (long)*(int *)((long)GA[1000].nblock + uVar19 * 4 + local_690);
                lVar31 = (IVar12 % lVar13) * 8 + *(long *)(pcVar1 + 0x1e8);
                hi_loc[uVar19 - 0x20] = *(Integer *)(lVar31 + lVar34 * 8);
                if (IVar12 % lVar13 == lVar13 + -1) {
                  lVar31 = *(long *)((long)GA[1000].dims + uVar19 * 8 + local_690);
                }
                else {
                  lVar31 = *(long *)(lVar31 + 8 + lVar34 * 8) + -1;
                }
                lVar34 = lVar34 + lVar13;
                _hi[uVar19] = lVar31;
                IVar12 = IVar12 / lVar13;
              }
            }
          }
          else {
            iVar29 = 0;
            if (0 < (short)uVar20) {
              iVar29 = (int)(short)uVar20;
            }
            for (lVar34 = 0; iVar29 != lVar34; lVar34 = lVar34 + 1) {
              hi_loc[lVar34 + -0x20] = 0;
              _hi[lVar34] = -1;
            }
          }
        }
        lVar34 = local_5b0;
        lVar13 = local_6d8 - 1;
        if (lVar13 == 0) {
          ld_loc[0] = (_hi[0] - err_string._0_8_) + *(long *)((long)GA->width + local_6e8) * 2 + 1;
        }
        lVar31 = 0;
        if (0 < lVar13) {
          lVar31 = lVar13;
        }
        lVar28 = 0;
        lVar17 = 1;
        for (lVar14 = 0; lVar31 != lVar14; lVar14 = lVar14 + 1) {
          lVar28 = lVar28 + plo_snd[lVar14] * lVar17;
          lVar18 = (_hi[lVar14] - hi_loc[lVar14 + -0x20]) +
                   *(long *)((long)GA->dims + lVar14 * 8 + local_5b0 + -0x30) * 2 + 1;
          ld_loc[lVar14] = lVar18;
          lVar17 = lVar17 * lVar18;
        }
        lVar14 = plo_snd[local_6d8 - 1];
        lVar18 = *(long *)(*(long *)(pcVar1 + 0x1e0) + proc * 8);
        iVar29 = *(int *)(pcVar1 + 0x18);
        if (iVar27 - 1U < 3) {
          lVar21 = local_670 % *(long *)(pcVar1 + 0x260);
          _index[0] = (int)lVar21;
          IVar12 = proc;
          lVar22 = 0;
          while (lVar22 + 1 < (long)local_6d8) {
            IVar12 = (long)((int)IVar12 - (int)lVar21) /
                     *(long *)((long)GA->dims + lVar22 * 8 + local_678 + -0x38);
            lVar21 = (long)(int)IVar12 % *(long *)((long)GA->dims + lVar22 * 8 + local_678 + -0x30);
            _index[lVar22 + 1] = (int)lVar21;
            lVar22 = lVar22 + 1;
          }
          uVar4 = 0;
          if (0 < (short)uVar20) {
            uVar4 = uVar20;
          }
          for (lVar22 = 0; (ulong)uVar4 * 4 != lVar22; lVar22 = lVar22 + 4) {
            iVar27 = *(int *)((long)_index + lVar22);
            lVar21 = *(long *)((long)GA[1000].block_dims + lVar22 * 2 + lVar9 + -0xd5068);
            *(long *)(err_string + lVar22 * 2) = lVar21 * iVar27 + 1;
            lVar21 = ((long)iVar27 + 1) * lVar21;
            lVar23 = *(long *)((long)GA[1000].dims + lVar22 * 2 + lVar7);
            if (lVar23 <= lVar21) {
              lVar21 = lVar23;
            }
            *(long *)((long)_hi + lVar22 * 2) = lVar21;
          }
        }
        else if (iVar27 == 4) {
          lVar21 = local_670 % *(long *)(pcVar1 + 0x260);
          _index[0] = (int)lVar21;
          IVar12 = proc;
          lVar22 = 0;
          while (lVar22 + 1 < (long)local_6d8) {
            IVar12 = (long)((int)IVar12 - (int)lVar21) /
                     *(long *)((long)GA->dims + lVar22 * 8 + local_678 + -0x38);
            lVar21 = (long)(int)IVar12 % *(long *)((long)GA->dims + lVar22 * 8 + local_678 + -0x30);
            _index[lVar22 + 1] = (int)lVar21;
            lVar22 = lVar22 + 1;
          }
          lVar22 = 0;
          if ((short)uVar20 < 1) {
            uVar20 = 0;
          }
          local_6b0 = GA->name + local_6e8 + -8;
          iVar27 = 0;
          for (; (ulong)uVar20 * 4 != lVar22; lVar22 = lVar22 + 4) {
            lVar21 = *(long *)local_6b0;
            iVar26 = *(int *)((long)_index + lVar22);
            lVar25 = (long)iVar27 + (long)iVar26;
            *(undefined8 *)(err_string + lVar22 * 2) = *(undefined8 *)(lVar21 + lVar25 * 8);
            lVar23 = *(long *)(pcVar1 + lVar22 * 2 + 0x260);
            if ((long)iVar26 < lVar23 + -1) {
              lVar21 = *(long *)(lVar21 + 8 + lVar25 * 8) + -1;
            }
            else {
              lVar21 = *(long *)(pcVar1 + lVar22 * 2 + 0x30);
            }
            *(long *)((long)_hi + lVar22 * 2) = lVar21;
            iVar27 = iVar27 + (int)lVar23;
          }
        }
        else if (iVar27 == 0) {
          local_6b0 = pcVar1;
          if (*(long *)(pcVar1 + 0x2a8) == 0) {
            uVar24 = local_6d8;
            if ((long)local_6d8 < 1) {
              uVar24 = 0;
            }
            lVar22 = 1;
            for (uVar19 = 0; uVar24 != uVar19; uVar19 = uVar19 + 1) {
              lVar22 = lVar22 * *(int *)((long)GA->dims + uVar19 * 4 + local_680 + -0x30);
            }
            if ((proc < 0) || (lVar22 <= proc)) {
              for (uVar19 = 0; uVar24 != uVar19; uVar19 = uVar19 + 1) {
                hi_loc[uVar19 - 0x20] = 0;
                _hi[uVar19] = -1;
              }
            }
            else {
              lVar22 = 0;
              IVar12 = proc;
              for (uVar19 = 0; uVar24 != uVar19; uVar19 = uVar19 + 1) {
                lVar23 = (long)*(int *)((long)GA[1000].nblock + uVar19 * 4 + local_690);
                lVar21 = (IVar12 % lVar23) * 8 + *(long *)(pcVar1 + 0x1e8);
                hi_loc[uVar19 - 0x20] = *(Integer *)(lVar21 + lVar22 * 8);
                if (IVar12 % lVar23 == lVar23 + -1) {
                  lVar21 = *(long *)((long)GA[1000].dims + uVar19 * 8 + local_690);
                }
                else {
                  lVar21 = *(long *)(lVar21 + 8 + lVar22 * 8) + -1;
                }
                lVar22 = lVar22 + lVar23;
                _hi[uVar19] = lVar21;
                IVar12 = IVar12 / lVar23;
              }
            }
          }
          else if (proc < *(long *)(pcVar1 + 0x2a8)) {
            uVar24 = local_6d8;
            if ((long)local_6d8 < 1) {
              uVar24 = 0;
            }
            lVar22 = 1;
            for (uVar19 = 0; uVar24 != uVar19; uVar19 = uVar19 + 1) {
              lVar22 = lVar22 * *(int *)((long)GA->dims + uVar19 * 4 + local_680 + -0x30);
            }
            if ((proc < 0) || (lVar22 <= proc)) {
              for (uVar19 = 0; uVar24 != uVar19; uVar19 = uVar19 + 1) {
                hi_loc[uVar19 - 0x20] = 0;
                _hi[uVar19] = -1;
              }
            }
            else {
              lVar22 = 0;
              IVar12 = proc;
              for (uVar19 = 0; uVar24 != uVar19; uVar19 = uVar19 + 1) {
                lVar23 = (long)*(int *)((long)GA[1000].nblock + uVar19 * 4 + local_690);
                lVar21 = (IVar12 % lVar23) * 8 + *(long *)(pcVar1 + 0x1e8);
                hi_loc[uVar19 - 0x20] = *(Integer *)(lVar21 + lVar22 * 8);
                if (IVar12 % lVar23 == lVar23 + -1) {
                  lVar21 = *(long *)((long)GA[1000].dims + uVar19 * 8 + local_690);
                }
                else {
                  lVar21 = *(long *)(lVar21 + 8 + lVar22 * 8) + -1;
                }
                lVar22 = lVar22 + lVar23;
                _hi[uVar19] = lVar21;
                IVar12 = IVar12 / lVar23;
              }
            }
          }
          else {
            iVar27 = 0;
            if (0 < (short)uVar20) {
              iVar27 = (int)(short)uVar20;
            }
            for (lVar22 = 0; iVar27 != lVar22; lVar22 = lVar22 + 1) {
              hi_loc[lVar22 + -0x20] = 0;
              _hi[lVar22] = -1;
            }
          }
        }
        if (lVar13 == 0) {
          ld_loc[0] = (_hi[0] - err_string._0_8_) + *(long *)((long)GA->width + local_6e8) * 2 + 1;
        }
        lVar13 = 1;
        lVar22 = 0;
        for (lVar21 = 0; lVar31 != lVar21; lVar21 = lVar21 + 1) {
          lVar22 = lVar22 + plo_rcv[lVar21] * lVar13;
          lVar23 = (_hi[lVar21] - hi_loc[lVar21 + -0x20]) +
                   *(long *)((long)GA->dims + lVar21 * 8 + lVar34 + -0x30) * 2 + 1;
          ld_loc[lVar21] = lVar23;
          lVar13 = lVar13 * lVar23;
        }
        lVar34 = plo_rcv[local_6d8 - 1];
        iVar27 = (int)local_660;
        stride_snd[0] = iVar27;
        stride_rcv[0] = iVar27;
        uVar19 = local_660 & 0xffffffff;
        uVar24 = local_660;
        for (lVar31 = 0; local_5a8 != lVar31; lVar31 = lVar31 + 1) {
          IVar12 = ld_loc[lVar31];
          uVar16 = (int)uVar24 * (int)IVar12;
          uVar24 = (ulong)uVar16;
          stride_rcv[lVar31] = uVar16;
          uVar5 = (int)uVar19 * (int)IVar12;
          uVar19 = (ulong)uVar5;
          stride_snd[lVar31] = uVar5;
          stride_rcv[lVar31 + 1] = uVar16;
          stride_snd[lVar31 + 1] = uVar5;
        }
        for (lVar31 = 0; lVar36 != lVar31; lVar31 = lVar31 + 1) {
          count[lVar31] = ((int)phi_rcv[lVar31] - (int)plo_rcv[lVar31]) + 1;
        }
        lVar31 = 1;
        for (lVar21 = 0; lVar36 != lVar21; lVar21 = lVar21 + 1) {
          lVar31 = lVar31 * ((phi_snd[lVar21] - plo_snd[lVar21]) + 1);
        }
        count[0] = count[0] * iVar27;
        local_6c0 = lVar18;
        armci_write_strided((void *)((lVar17 * lVar14 + lVar28) * (long)iVar29 + lVar18),local_684,
                            stride_snd,count,local_6d0);
        if (GAme != local_6a0) {
          iVar26 = (int)lVar31 * (int)local_660;
          uVar24 = (ulong)*(int *)((long)GA->nblock + lVar35 * 4 + local_6e8);
          iVar27 = (int)local_6a0;
          iVar30 = (int)local_6b8;
          if ((uVar24 & 1) == 0) {
            if ((*(byte *)(index + lVar35) & 1) == 0) {
              armci_msg_rcv(iVar30,local_6e0,(int)local_6a8,&msglen,(int)local_6c8);
            }
            else {
              armci_msg_snd(iVar30,local_6d0,iVar26,iVar27);
            }
            if ((*(byte *)(index + lVar35) & 1) == 0) {
              armci_msg_snd((int)local_6b8,local_6d0,iVar26,iVar27);
              pcVar32 = local_6e0;
              goto LAB_0017dbf6;
            }
          }
          else {
            uVar24 = uVar24 - 1;
            local_6d8 = uVar24;
            if ((index[lVar35] & 1U) == 0) {
              if (index[lVar35] != uVar24) {
                armci_msg_rcv(iVar30,local_6e0,(int)local_6a8,&msglen,(int)local_6c8);
                goto LAB_0017db5a;
              }
            }
            else {
              armci_msg_snd(iVar30,local_6d0,iVar26,iVar27);
LAB_0017db5a:
              uVar24 = index[lVar35];
            }
            if ((uVar24 & 1) == 0) {
              if (uVar24 != 0) {
                armci_msg_snd((int)local_6b8,local_6d0,iVar26,iVar27);
              }
            }
            else {
              armci_msg_rcv((int)local_6b8,local_6e0,(int)local_6a8,&msglen,(int)local_6c8);
            }
            uVar24 = index[lVar35];
            if (uVar24 == 0) {
              armci_msg_snd((int)local_6b8,local_6d0,iVar26,iVar27);
              uVar24 = index[lVar35];
            }
            pcVar32 = local_6e0;
            if (uVar24 != local_6d8) goto LAB_0017dbf6;
          }
          pcVar32 = local_6e0;
          armci_msg_rcv((int)local_6b8,local_6e0,(int)local_6a8,&msglen,(int)local_6c8);
        }
LAB_0017dbf6:
        armci_read_strided((void *)(lVar18 + (lVar13 * lVar34 + lVar22) * (long)iVar29),local_684,
                           stride_rcv,count,pcVar32);
        get_remote_block_pos(lVar35,ndim,lo_loc,hi_loc,slo_rcv,shi_rcv,dims,width);
        IVar12 = local_5a0;
        proclist = local_698;
        lVar6 = pnga_locate_region(local_5a0,slo_rcv,shi_rcv,map,(Integer *)local_698,&np);
        if (lVar6 == 0) {
          builtin_strncpy(err_string,"cannot locate region: ",0x17);
          strcpy(err_string + 0x16,GA->name + local_6e8);
          sVar11 = strlen(err_string);
          sprintf(err_string + (int)sVar11," [%ld:%ld ",slo_rcv[0],shi_rcv[0]);
          sVar11 = strlen(err_string);
          lVar34 = 1;
          while( true ) {
            IVar15 = pnga_ndim(IVar12);
            pcVar32 = err_string + (int)sVar11;
            if (IVar15 <= lVar34) break;
            sprintf(pcVar32,",%ld:%ld ",slo_rcv[lVar34],shi_rcv[lVar34]);
            sVar11 = strlen(err_string);
            lVar34 = lVar34 + 1;
          }
          pcVar32[0] = ']';
          pcVar32[1] = '\0';
          pnga_error(err_string,IVar12);
          proclist = local_698;
        }
        local_6c8 = *proclist;
        if (-1 < iVar3) {
          local_6c8 = (ulong)(uint)PGRP_LIST[iVar3].inv_map_proc_list[local_6c8];
        }
        local_6c0 = local_6b8 + 1;
        for (lVar34 = 0; lVar36 != lVar34; lVar34 = lVar34 + 1) {
          if (lVar35 == lVar34) {
            lVar13 = lo_loc[lVar35] - local_668;
            lVar31 = lo_loc[lVar35] + -1;
          }
          else {
            lVar13 = lo_loc[lVar34];
            lVar31 = hi_loc[lVar34];
          }
          lo_rcv[lVar34] = lVar13;
          hi_rcv[lVar34] = lVar31;
        }
        for (lVar34 = 0; lVar36 != lVar34; lVar34 = lVar34 + 1) {
          if (lVar35 == lVar34) {
            if (hi_rcv[lVar35] < 1) {
              shi_rcv[lVar35] = dims[lVar35];
              slo_rcv[lVar35] = (dims[lVar35] - width[lVar35]) + 1;
            }
            else {
              slo_rcv[lVar35] = lo_rcv[lVar35];
              shi_rcv[lVar35] = hi_rcv[lVar35];
            }
          }
          else {
            slo_rcv[lVar34] = lo_rcv[lVar34];
            shi_rcv[lVar34] = hi_rcv[lVar34];
          }
        }
        lVar6 = pnga_locate_region(IVar12,slo_rcv,shi_rcv,map,(Integer *)proclist,&np);
        if (lVar6 == 0) {
          builtin_strncpy(err_string,"cannot locate region: ",0x17);
          strcpy(err_string + 0x16,GA->name + local_6e8);
          sVar11 = strlen(err_string);
          sprintf(err_string + (int)sVar11," [%ld:%ld ",slo_rcv[0],shi_rcv[0]);
          sVar11 = strlen(err_string);
          lVar34 = 1;
          while( true ) {
            IVar15 = pnga_ndim(IVar12);
            pcVar32 = err_string + (int)sVar11;
            if (IVar15 <= lVar34) break;
            sprintf(pcVar32,",%ld:%ld ",slo_rcv[lVar34],shi_rcv[lVar34]);
            sVar11 = strlen(err_string);
            lVar34 = lVar34 + 1;
          }
          pcVar32[0] = ']';
          pcVar32[1] = '\0';
          pnga_error(err_string,IVar12);
          proclist = local_698;
        }
        puVar8 = local_698;
        pcVar32 = local_6d0;
        local_6a0 = *proclist;
        if (-1 < iVar3) {
          local_6a0 = (ulong)PGRP_LIST[iVar3].inv_map_proc_list[local_6a0];
        }
        for (lVar34 = 0; lVar36 * 8 != lVar34; lVar34 = lVar34 + 8) {
          if (*(long *)((long)increment + lVar34) == 0) {
            if (lVar10 == lVar34) {
              plo_snd[lVar35] = (hi_loc[lVar35] - lo_loc[lVar35]) + 1;
              plo_rcv[lVar35] = 0;
              phi_snd[lVar35] = (hi_loc[lVar35] - lo_loc[lVar35]) + width[lVar35];
              phi_rcv[lVar35] = width[lVar35] + -1;
            }
            else {
              lVar13 = *(long *)((long)width + lVar34);
              *(long *)((long)plo_snd + lVar34) = lVar13;
              lVar31 = (*(long *)((long)hi_loc + lVar34) - *(long *)((long)lo_loc + lVar34)) +
                       lVar13;
              *(long *)((long)phi_snd + lVar34) = lVar31;
              *(long *)((long)plo_rcv + lVar34) = lVar13;
              *(long *)((long)phi_rcv + lVar34) = lVar31;
            }
          }
          else {
            *(undefined8 *)((long)plo_rcv + lVar34) = 0;
            lVar13 = (*(long *)((long)hi_loc + lVar34) - *(long *)((long)lo_loc + lVar34)) +
                     *(long *)((long)increment + lVar34);
            *(long *)((long)phi_rcv + lVar34) = lVar13;
            *(undefined8 *)((long)plo_snd + lVar34) = 0;
            *(long *)((long)phi_snd + lVar34) = lVar13;
          }
        }
        pcVar1 = (char *)((long)GA->dims + local_6e8 + -0x30);
        uVar20 = *(ushort *)((long)GA->dims + local_6e8 + -0x30);
        uVar24 = (ulong)(short)uVar20;
        iVar27 = *(int *)((long)GA->block_dims + local_6e8 + -4);
        if (iVar27 - 1U < 3) {
          lVar13 = local_670 % *(long *)(pcVar1 + 0x260);
          _index[0] = (int)lVar13;
          IVar12 = proc;
          lVar34 = 0;
          while (lVar34 + 1 < (long)uVar24) {
            IVar12 = (long)((int)IVar12 - (int)lVar13) /
                     *(long *)((long)GA->dims + lVar34 * 8 + local_678 + -0x38);
            lVar13 = (long)(int)IVar12 % *(long *)((long)GA->dims + lVar34 * 8 + local_678 + -0x30);
            _index[lVar34 + 1] = (int)lVar13;
            lVar34 = lVar34 + 1;
          }
          uVar4 = 0;
          if (0 < (short)uVar20) {
            uVar4 = uVar20;
          }
          for (lVar34 = 0; (ulong)uVar4 * 4 != lVar34; lVar34 = lVar34 + 4) {
            iVar29 = *(int *)((long)_index + lVar34);
            lVar13 = *(long *)((long)GA[1000].block_dims + lVar34 * 2 + lVar9 + -0xd5068);
            *(long *)(err_string + lVar34 * 2) = lVar13 * iVar29 + 1;
            lVar13 = ((long)iVar29 + 1) * lVar13;
            lVar31 = *(long *)((long)GA[1000].dims + lVar34 * 2 + lVar7);
            if (lVar31 <= lVar13) {
              lVar13 = lVar31;
            }
            *(long *)((long)_hi + lVar34 * 2) = lVar13;
          }
        }
        else if (iVar27 == 4) {
          lVar13 = local_670 % *(long *)(pcVar1 + 0x260);
          _index[0] = (int)lVar13;
          IVar12 = proc;
          lVar34 = 0;
          while (lVar34 + 1 < (long)uVar24) {
            IVar12 = (long)((int)IVar12 - (int)lVar13) /
                     *(long *)((long)GA->dims + lVar34 * 8 + local_678 + -0x38);
            lVar13 = (long)(int)IVar12 % *(long *)((long)GA->dims + lVar34 * 8 + local_678 + -0x30);
            _index[lVar34 + 1] = (int)lVar13;
            lVar34 = lVar34 + 1;
          }
          lVar34 = 0;
          uVar4 = 0;
          if (0 < (short)uVar20) {
            uVar4 = uVar20;
          }
          iVar29 = 0;
          for (; (ulong)uVar4 * 4 != lVar34; lVar34 = lVar34 + 4) {
            lVar13 = *(long *)(GA->name + local_6e8 + -8);
            iVar26 = *(int *)((long)_index + lVar34);
            lVar17 = (long)iVar29 + (long)iVar26;
            *(undefined8 *)(err_string + lVar34 * 2) = *(undefined8 *)(lVar13 + lVar17 * 8);
            lVar31 = *(long *)(pcVar1 + lVar34 * 2 + 0x260);
            if ((long)iVar26 < lVar31 + -1) {
              lVar13 = *(long *)(lVar13 + 8 + lVar17 * 8) + -1;
            }
            else {
              lVar13 = *(long *)(pcVar1 + lVar34 * 2 + 0x30);
            }
            *(long *)((long)_hi + lVar34 * 2) = lVar13;
            iVar29 = iVar29 + (int)lVar31;
          }
        }
        else if (iVar27 == 0) {
          if (*(long *)(pcVar1 + 0x2a8) == 0) {
            uVar19 = 0;
            if (0 < (long)uVar24) {
              uVar19 = uVar24;
            }
            lVar34 = 1;
            for (uVar33 = 0; uVar19 != uVar33; uVar33 = uVar33 + 1) {
              lVar34 = lVar34 * *(int *)((long)GA->dims + uVar33 * 4 + local_680 + -0x30);
            }
            if ((proc < 0) || (lVar34 <= proc)) {
              for (uVar33 = 0; uVar19 != uVar33; uVar33 = uVar33 + 1) {
                hi_loc[uVar33 - 0x20] = 0;
                _hi[uVar33] = -1;
              }
            }
            else {
              lVar34 = 0;
              IVar12 = proc;
              for (uVar33 = 0; uVar19 != uVar33; uVar33 = uVar33 + 1) {
                lVar13 = (long)*(int *)((long)GA[1000].nblock + uVar33 * 4 + local_690);
                lVar31 = (IVar12 % lVar13) * 8 + *(long *)(pcVar1 + 0x1e8);
                hi_loc[uVar33 - 0x20] = *(Integer *)(lVar31 + lVar34 * 8);
                if (IVar12 % lVar13 == lVar13 + -1) {
                  lVar31 = *(long *)((long)GA[1000].dims + uVar33 * 8 + local_690);
                }
                else {
                  lVar31 = *(long *)(lVar31 + 8 + lVar34 * 8) + -1;
                }
                lVar34 = lVar34 + lVar13;
                _hi[uVar33] = lVar31;
                IVar12 = IVar12 / lVar13;
              }
            }
          }
          else if (proc < *(long *)(pcVar1 + 0x2a8)) {
            uVar19 = 0;
            if (0 < (long)uVar24) {
              uVar19 = uVar24;
            }
            lVar34 = 1;
            for (uVar33 = 0; uVar19 != uVar33; uVar33 = uVar33 + 1) {
              lVar34 = lVar34 * *(int *)((long)GA->dims + uVar33 * 4 + local_680 + -0x30);
            }
            if ((proc < 0) || (lVar34 <= proc)) {
              for (uVar33 = 0; uVar19 != uVar33; uVar33 = uVar33 + 1) {
                hi_loc[uVar33 - 0x20] = 0;
                _hi[uVar33] = -1;
              }
            }
            else {
              lVar34 = 0;
              IVar12 = proc;
              for (uVar33 = 0; uVar19 != uVar33; uVar33 = uVar33 + 1) {
                lVar13 = (long)*(int *)((long)GA[1000].nblock + uVar33 * 4 + local_690);
                lVar31 = (IVar12 % lVar13) * 8 + *(long *)(pcVar1 + 0x1e8);
                hi_loc[uVar33 - 0x20] = *(Integer *)(lVar31 + lVar34 * 8);
                if (IVar12 % lVar13 == lVar13 + -1) {
                  lVar31 = *(long *)((long)GA[1000].dims + uVar33 * 8 + local_690);
                }
                else {
                  lVar31 = *(long *)(lVar31 + 8 + lVar34 * 8) + -1;
                }
                lVar34 = lVar34 + lVar13;
                _hi[uVar33] = lVar31;
                IVar12 = IVar12 / lVar13;
              }
            }
          }
          else {
            iVar29 = 0;
            if (0 < (short)uVar20) {
              iVar29 = (int)(short)uVar20;
            }
            for (lVar34 = 0; iVar29 != lVar34; lVar34 = lVar34 + 1) {
              hi_loc[lVar34 + -0x20] = 0;
              _hi[lVar34] = -1;
            }
          }
        }
        lVar34 = local_5b0;
        lVar13 = uVar24 - 1;
        if (lVar13 == 0) {
          ld_loc[0] = (_hi[0] - err_string._0_8_) + *(long *)((long)GA->width + local_6e8) * 2 + 1;
        }
        lVar31 = 0;
        if (0 < lVar13) {
          lVar31 = lVar13;
        }
        lVar17 = 1;
        lVar28 = 0;
        for (lVar14 = 0; lVar31 != lVar14; lVar14 = lVar14 + 1) {
          lVar28 = lVar28 + plo_snd[lVar14] * lVar17;
          lVar18 = (_hi[lVar14] - hi_loc[lVar14 + -0x20]) +
                   *(long *)((long)GA->dims + lVar14 * 8 + local_5b0 + -0x30) * 2 + 1;
          ld_loc[lVar14] = lVar18;
          lVar17 = lVar17 * lVar18;
        }
        lVar14 = plo_snd[uVar24 - 1];
        local_668 = *(long *)(*(long *)(pcVar1 + 0x1e0) + proc * 8);
        iVar29 = *(int *)(pcVar1 + 0x18);
        if (iVar27 - 1U < 3) {
          lVar22 = local_670 % *(long *)(pcVar1 + 0x260);
          _index[0] = (int)lVar22;
          IVar12 = proc;
          lVar18 = 0;
          while (lVar18 + 1 < (long)uVar24) {
            IVar12 = (long)((int)IVar12 - (int)lVar22) /
                     *(long *)((long)GA->dims + lVar18 * 8 + local_678 + -0x38);
            lVar22 = (long)(int)IVar12 % *(long *)((long)GA->dims + lVar18 * 8 + local_678 + -0x30);
            _index[lVar18 + 1] = (int)lVar22;
            lVar18 = lVar18 + 1;
          }
          uVar4 = 0;
          if (0 < (short)uVar20) {
            uVar4 = uVar20;
          }
          for (lVar18 = 0; (ulong)uVar4 * 4 != lVar18; lVar18 = lVar18 + 4) {
            iVar27 = *(int *)((long)_index + lVar18);
            lVar22 = *(long *)((long)GA[1000].block_dims + lVar18 * 2 + lVar9 + -0xd5068);
            *(long *)(err_string + lVar18 * 2) = lVar22 * iVar27 + 1;
            lVar22 = ((long)iVar27 + 1) * lVar22;
            lVar21 = *(long *)((long)GA[1000].dims + lVar18 * 2 + lVar7);
            if (lVar21 <= lVar22) {
              lVar22 = lVar21;
            }
            *(long *)((long)_hi + lVar18 * 2) = lVar22;
          }
        }
        else {
          local_6d8 = uVar24;
          if (iVar27 == 4) {
            lVar22 = local_670 % *(long *)(pcVar1 + 0x260);
            _index[0] = (int)lVar22;
            IVar12 = proc;
            lVar18 = 0;
            while (lVar18 + 1 < (long)uVar24) {
              IVar12 = (long)((int)IVar12 - (int)lVar22) /
                       *(long *)((long)GA->dims + lVar18 * 8 + local_678 + -0x38);
              lVar22 = (long)(int)IVar12 %
                       *(long *)((long)GA->dims + lVar18 * 8 + local_678 + -0x30);
              _index[lVar18 + 1] = (int)lVar22;
              lVar18 = lVar18 + 1;
            }
            lVar18 = 0;
            if ((short)uVar20 < 1) {
              uVar20 = 0;
            }
            local_6b0 = GA->name + local_6e8 + -8;
            iVar27 = 0;
            for (; (ulong)uVar20 * 4 != lVar18; lVar18 = lVar18 + 4) {
              lVar22 = *(long *)local_6b0;
              iVar26 = *(int *)((long)_index + lVar18);
              lVar23 = (long)iVar27 + (long)iVar26;
              *(undefined8 *)(err_string + lVar18 * 2) = *(undefined8 *)(lVar22 + lVar23 * 8);
              lVar21 = *(long *)(pcVar1 + lVar18 * 2 + 0x260);
              if ((long)iVar26 < lVar21 + -1) {
                lVar22 = *(long *)(lVar22 + 8 + lVar23 * 8) + -1;
              }
              else {
                lVar22 = *(long *)(pcVar1 + lVar18 * 2 + 0x30);
              }
              *(long *)((long)_hi + lVar18 * 2) = lVar22;
              iVar27 = iVar27 + (int)lVar21;
            }
          }
          else if (iVar27 == 0) {
            if (*(long *)(pcVar1 + 0x2a8) == 0) {
              uVar19 = uVar24;
              if ((long)uVar24 < 1) {
                uVar19 = 0;
              }
              lVar18 = 1;
              for (uVar33 = 0; uVar19 != uVar33; uVar33 = uVar33 + 1) {
                lVar18 = lVar18 * *(int *)((long)GA->dims + uVar33 * 4 + local_680 + -0x30);
              }
              if ((proc < 0) || (lVar18 <= proc)) {
                for (uVar33 = 0; uVar19 != uVar33; uVar33 = uVar33 + 1) {
                  hi_loc[uVar33 - 0x20] = 0;
                  _hi[uVar33] = -1;
                }
              }
              else {
                lVar18 = 0;
                IVar12 = proc;
                for (uVar33 = 0; local_6b0 = pcVar1, uVar19 != uVar33; uVar33 = uVar33 + 1) {
                  lVar21 = (long)*(int *)((long)GA[1000].nblock + uVar33 * 4 + local_690);
                  lVar22 = (IVar12 % lVar21) * 8 + *(long *)(pcVar1 + 0x1e8);
                  hi_loc[uVar33 - 0x20] = *(Integer *)(lVar22 + lVar18 * 8);
                  if (IVar12 % lVar21 == lVar21 + -1) {
                    lVar22 = *(long *)((long)GA[1000].dims + uVar33 * 8 + local_690);
                  }
                  else {
                    lVar22 = *(long *)(lVar22 + 8 + lVar18 * 8) + -1;
                  }
                  lVar18 = lVar18 + lVar21;
                  _hi[uVar33] = lVar22;
                  IVar12 = IVar12 / lVar21;
                }
              }
            }
            else if (proc < *(long *)(pcVar1 + 0x2a8)) {
              uVar19 = uVar24;
              if ((long)uVar24 < 1) {
                uVar19 = 0;
              }
              lVar18 = 1;
              for (uVar33 = 0; uVar19 != uVar33; uVar33 = uVar33 + 1) {
                lVar18 = lVar18 * *(int *)((long)GA->dims + uVar33 * 4 + local_680 + -0x30);
              }
              if ((proc < 0) || (lVar18 <= proc)) {
                for (uVar33 = 0; uVar19 != uVar33; uVar33 = uVar33 + 1) {
                  hi_loc[uVar33 - 0x20] = 0;
                  _hi[uVar33] = -1;
                }
              }
              else {
                lVar18 = 0;
                IVar12 = proc;
                for (uVar33 = 0; local_6b0 = pcVar1, uVar19 != uVar33; uVar33 = uVar33 + 1) {
                  lVar21 = (long)*(int *)((long)GA[1000].nblock + uVar33 * 4 + local_690);
                  lVar22 = (IVar12 % lVar21) * 8 + *(long *)(pcVar1 + 0x1e8);
                  hi_loc[uVar33 - 0x20] = *(Integer *)(lVar22 + lVar18 * 8);
                  if (IVar12 % lVar21 == lVar21 + -1) {
                    lVar22 = *(long *)((long)GA[1000].dims + uVar33 * 8 + local_690);
                  }
                  else {
                    lVar22 = *(long *)(lVar22 + 8 + lVar18 * 8) + -1;
                  }
                  lVar18 = lVar18 + lVar21;
                  _hi[uVar33] = lVar22;
                  IVar12 = IVar12 / lVar21;
                }
              }
            }
            else {
              iVar27 = 0;
              if (0 < (short)uVar20) {
                iVar27 = (int)(short)uVar20;
              }
              for (lVar18 = 0; iVar27 != lVar18; lVar18 = lVar18 + 1) {
                hi_loc[lVar18 + -0x20] = 0;
                _hi[lVar18] = -1;
              }
            }
          }
        }
        if (lVar13 == 0) {
          ld_loc[0] = (_hi[0] - err_string._0_8_) + *(long *)((long)GA->width + local_6e8) * 2 + 1;
        }
        lVar13 = 1;
        lVar18 = 0;
        for (lVar22 = 0; lVar31 != lVar22; lVar22 = lVar22 + 1) {
          lVar18 = lVar18 + plo_rcv[lVar22] * lVar13;
          lVar21 = (_hi[lVar22] - hi_loc[lVar22 + -0x20]) +
                   *(long *)((long)GA->dims + lVar22 * 8 + lVar34 + -0x30) * 2 + 1;
          ld_loc[lVar22] = lVar21;
          lVar13 = lVar13 * lVar21;
        }
        lVar34 = plo_rcv[uVar24 - 1];
        iVar27 = (int)local_660;
        stride_snd[0] = iVar27;
        stride_rcv[0] = iVar27;
        uVar19 = local_660 & 0xffffffff;
        uVar24 = local_660;
        for (lVar31 = 0; local_5a8 != lVar31; lVar31 = lVar31 + 1) {
          IVar12 = ld_loc[lVar31];
          uVar16 = (int)uVar24 * (int)IVar12;
          uVar24 = (ulong)uVar16;
          stride_rcv[lVar31] = uVar16;
          uVar5 = (int)uVar19 * (int)IVar12;
          uVar19 = (ulong)uVar5;
          stride_snd[lVar31] = uVar5;
          stride_rcv[lVar31 + 1] = uVar16;
          stride_snd[lVar31 + 1] = uVar5;
        }
        for (lVar31 = 0; lVar36 != lVar31; lVar31 = lVar31 + 1) {
          count[lVar31] = ((int)phi_rcv[lVar31] - (int)plo_rcv[lVar31]) + 1;
        }
        lVar31 = 1;
        for (lVar22 = 0; lVar36 != lVar22; lVar22 = lVar22 + 1) {
          lVar31 = lVar31 * ((phi_snd[lVar22] - plo_snd[lVar22]) + 1);
        }
        count[0] = count[0] * iVar27;
        armci_write_strided((void *)((lVar17 * lVar14 + lVar28) * (long)iVar29 + local_668),
                            local_684,stride_snd,count,local_6d0);
        if (GAme != local_6a0) {
          iVar27 = (int)lVar31 * (int)local_660;
          uVar24 = (ulong)*(int *)((long)GA->nblock + lVar35 * 4 + local_6e8);
          iVar26 = (int)local_6c0;
          if ((uVar24 & 1) == 0) {
            if ((*(byte *)(index + lVar35) & 1) == 0) {
              armci_msg_rcv(iVar26,local_6e0,(int)local_6a8,&msglen,(int)local_6a0);
            }
            else {
              armci_msg_snd(iVar26,local_6d0,iVar27,(int)local_6c8);
            }
            puVar8 = local_698;
            iVar30 = (int)local_6c0;
            if ((*(byte *)(index + lVar35) & 1) == 0) {
              armci_msg_snd(iVar30,local_6d0,iVar27,(int)local_6c8);
              pcVar32 = local_6e0;
              goto LAB_0017ecfe;
            }
            iVar27 = (int)local_6a8;
            iVar26 = (int)local_6a0;
          }
          else {
            if ((index[lVar35] & 1U) == 0) {
              if (index[lVar35] != 0) {
                armci_msg_rcv(iVar26,local_6e0,(int)local_6a8,&msglen,(int)local_6a0);
              }
            }
            else {
              armci_msg_snd(iVar26,local_6d0,iVar27,(int)local_6c8);
            }
            iVar26 = (int)local_6a0;
            uVar24 = uVar24 - 1;
            if ((index[lVar35] & 1U) == 0) {
              if (index[lVar35] != uVar24) {
                armci_msg_snd((int)local_6c0,local_6d0,iVar27,(int)local_6c8);
                goto LAB_0017ec9b;
              }
            }
            else {
              armci_msg_rcv((int)local_6c0,local_6e0,(int)local_6a8,&msglen,iVar26);
LAB_0017ec9b:
              iVar26 = (int)local_6a0;
            }
            uVar19 = index[lVar35];
            if (uVar19 == uVar24) {
              armci_msg_snd((int)local_6c0,local_6d0,iVar27,(int)local_6c8);
              iVar26 = (int)local_6a0;
              uVar19 = index[lVar35];
            }
            puVar8 = local_698;
            pcVar32 = local_6e0;
            if (uVar19 != 0) goto LAB_0017ecfe;
            iVar30 = (int)local_6c0;
            iVar27 = (int)local_6a8;
          }
          puVar8 = local_698;
          pcVar32 = local_6e0;
          armci_msg_rcv(iVar30,local_6e0,iVar27,&msglen,iVar26);
        }
LAB_0017ecfe:
        armci_read_strided((void *)(local_668 + (lVar13 * lVar34 + lVar18) * (long)iVar29),local_684
                           ,stride_rcv,count,pcVar32);
        local_6b8 = local_6b8 + 2;
        g_a = local_5a0;
      }
      if (*(int *)((long)GA->block_dims + local_6e8 + -8) != 0) {
        increment[lVar35] = width[lVar35] * 2;
      }
      lVar10 = lVar10 + 8;
    }
    pnga_free(local_6e0);
    pnga_free(local_6d0);
    free(map);
    free(puVar8);
  }
  return 1;
}

Assistant:

logical pnga_update44_ghosts(Integer g_a)
{
  Integer idx, idir, i, np, handle=GA_OFFSET + g_a;
  Integer size, buflen, buftot, bufsize, ndim, increment[MAXDIM];
  Integer proc_rem_snd, proc_rem_rcv, pmax;
  Integer msgcnt, length;
  Integer width[MAXDIM], dims[MAXDIM], index[MAXDIM];
  Integer lo_loc[MAXDIM], hi_loc[MAXDIM];
  Integer plo_snd[MAXDIM], phi_snd[MAXDIM];
  Integer lo_rcv[MAXDIM], hi_rcv[MAXDIM];
  Integer slo_rcv[MAXDIM], shi_rcv[MAXDIM];
  Integer plo_rcv[MAXDIM], phi_rcv[MAXDIM];
  Integer ld_loc[MAXDIM];
  int msglen;
  int stride_snd[MAXDIM], stride_rcv[MAXDIM],count[MAXDIM];
  char *ptr_snd, *ptr_rcv;
  char send_name[32], rcv_name[32];
  void *snd_ptr, *rcv_ptr, *snd_ptr_orig, *rcv_ptr_orig;
  Integer me = pnga_nodeid();
  Integer p_handle;
  Integer *_ga_map = NULL;
  Integer *_ga_proclist = NULL;

  /* This routine makes use of the shift algorithm to update data in the
   * ghost cells bounding the local block of visible data. The shift
   * algorithm starts by updating the blocks of data along the first
   * dimension by grabbing a block of data that is width[0] deep but
   * otherwise matches the  dimensions of the data residing on the
   * calling processor. The update of the second dimension, however,
   * grabs a block that is width[1] deep in the second dimension but is
   * ldim0 + 2*width[0] in the first dimensions where ldim0 is the
   * size of the visible data along the first dimension. The remaining
   * dimensions are left the same. For the next update, the width of the
   * second dimension is also increased by 2*width[1] and so on. This
   * algorith makes use of the fact that data for the dimensions that
   * have already been updated is available on each processor and can be
   * used in the updates of subsequent dimensions. The total number of
   * separate updates is 2*ndim, an update in the negative and positive
   * directions for each dimension.
   *
   * This implementation make use of explicit message passing to perform
   * the update. Separate message types for the updates in each coordinate
   * direction are used to maintain synchronization locally and to
   * guarantee that the data is present before the updates in a new
   * coordinate direction take place.
   *
   * To perform the update, this routine makes use of several copies of
   * indices marking the upper and lower limits of data. Indices
   * beginning with the character "p" are relative indices marking the
   * location of the data set relative to the origin the local patch of
   * the global array, all other indices are in absolute coordinates and
   * mark locations in the total global array. The indices used by this
   * routine are described below.
   *
   *       lo_loc[], hi_loc[]: The lower and upper indices of the visible
   *       block of data held by the calling processor.
   *
   *       lo_rcv[], hi_rcv[]: The lower and upper indices of the blocks
   *       of data that will be either sent to or received from a remote
   *       processor. These indices are NOT corrected for wrap-around
   *       (periodic) boundary conditions so they can be negative or greater
   *       than the array dimension values held in dims[].
   *
   *       slo_rcv[], shi_rcv[]: Similar to lo_rcv[] and hi_rcv[], except
   *       that these indices have been corrected for wrap-around
   *       boundary conditions.
   *
   *       plo_rcv[], phi_rcv[]: The local indices of the local data patch
   *       that receive that message from the remote processor.
   *
   *       plo_snd[], phi_snd[]: The local indices of the data patch
   *       that will be sent to the remote processor. Note that the
   *       dimensions of the patches represented by plo_rec[], plo_rec[] and
   *       plo_snd[], phi_snd[] must be the same.
   */

  /* if global array has no ghost cells, just return */
  if (!pnga_has_ghosts(g_a)) return TRUE;

  size = GA[handle].elemsize;
  ndim = GA[handle].ndim;
  p_handle = GA[handle].p_handle;

  /* initialize range increments and get array dimensions */
  for (idx=0; idx < ndim; idx++) {
    increment[idx] = 0;
    width[idx] = (Integer)GA[handle].width[idx];
    dims[idx] = (Integer)GA[handle].dims[idx];
  }

  /* Check to make sure that global array is well-behaved (all processors
     have data and the width of the data in each dimension is greater
     than the corresponding value in width[]. */
  if (!gai_check_ghost_distr(g_a)) return FALSE;

  _ga_map = malloc((GAnproc*2*MAXDIM+1)*sizeof(Integer));
  if(!_ga_map) pnga_error("pnga_update44_ghosts:malloc failed (_ga_map)",0);
  _ga_proclist = malloc(GAnproc*sizeof(Integer));
  if(!_ga_proclist) pnga_error("pnga_update44_ghosts:malloc failed (_ga_proclist)",0);

  msgcnt = 0;

  /* obtain range of data that is held by local processor */
  pnga_distribution(g_a,me,lo_loc,hi_loc);
  /* Get indices of processor in virtual grid */
  pnga_proc_topology(g_a, me, index);

  /* Try to find maximum size of message that will be sent during
   * update operations and use this to allocate memory for message
   * passing buffers. */
  buftot = 1;
  for (i=0; i<ndim; i++) {
    buftot *= (hi_loc[i]-lo_loc[i] + 1 + 2*width[i]);
  }
  buflen = 1;
  for (i = 0; i < ndim; i++) {
    idir =  hi_loc[i] - lo_loc[i] + 1;
    if (buflen < (buftot/(idir + 2*width[i]))*width[i]) {
      buflen = (buftot/(idir + 2*width[i]))*width[i];
    }
  }
  bufsize = size*buflen;
  strcpy(send_name,"send_buffer");
  strcpy(rcv_name,"receive_buffer");
  snd_ptr_orig = snd_ptr = pnga_malloc(buflen, GA[handle].type, send_name);
  rcv_ptr_orig = rcv_ptr = pnga_malloc(buflen, GA[handle].type, rcv_name);

  /* loop over dimensions for sequential update using shift algorithm */
  for (idx=0; idx < ndim; idx++) {

    /* Do not bother with update if nwidth is zero */
    if (width[idx] != 0) {

      /* Perform update in negative direction. */
      get_remote_block_neg(idx, ndim, lo_loc, hi_loc, slo_rcv, shi_rcv,
                           dims, width);
      /* locate processor with this data */
      if (!pnga_locate_region(g_a, slo_rcv, shi_rcv, _ga_map,
          _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
          slo_rcv, shi_rcv, g_a);
      proc_rem_snd = _ga_proclist[0];
      if (p_handle >= 0) {
        proc_rem_snd = PGRP_LIST[p_handle].inv_map_proc_list[proc_rem_snd];
      }

      /* Find processor from which data will be recieved */
      for (i = 0; i < ndim; i++) {
        if (i == idx) {
          lo_rcv[i] = hi_loc[i] + 1;
          hi_rcv[i] = hi_loc[i] + width[i];
        } else {
          lo_rcv[i] = lo_loc[i];
          hi_rcv[i] = hi_loc[i];
        }
      }

      /* Account for boundaries, if necessary. */
      for (i=0; i<ndim; i++) {
        if (i == idx) {
          if (hi_rcv[i] > dims[i]) {
            slo_rcv[i] = 1;
            shi_rcv[i] = width[i];
          } else {
            slo_rcv[i] = lo_rcv[i];
            shi_rcv[i] = hi_rcv[i];
          }
        } else {
          slo_rcv[i] = lo_rcv[i];
          shi_rcv[i] = hi_rcv[i];
        }
      }
      /* locate processor with this data */
      if (!pnga_locate_region(g_a, slo_rcv, shi_rcv, _ga_map,
          _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
          slo_rcv, shi_rcv, g_a);
      proc_rem_rcv = _ga_proclist[0];
      if (p_handle >= 0) {
        proc_rem_rcv = PGRP_LIST[p_handle].inv_map_proc_list[proc_rem_rcv];
      }

      /* Get actual coordinates of chunk of data that will be sent to
       * remote processor as well as coordinates of the array space that
       * will receive data from remote processor. */
      for (i = 0; i < ndim; i++) {
        if (increment[i] == 0) {
          if (i == idx) {
            plo_snd[i] = width[i];
            phi_snd[i] = 2*width[i] - 1;
            plo_rcv[i] = hi_loc[i] - lo_loc[i] + width[i] + 1;
            phi_rcv[i] = hi_loc[i] - lo_loc[i] + 2*width[i];
          } else {
            plo_snd[i] = width[i];
            phi_snd[i] = hi_loc[i] - lo_loc[i] + width[i];
            plo_rcv[i] = width[i];
            phi_rcv[i] = hi_loc[i] - lo_loc[i] + width[i];
          }
        } else {
          plo_rcv[i] = 0;
          phi_rcv[i] = hi_loc[i] - lo_loc[i] + increment[i];
          plo_snd[i] = 0;
          phi_snd[i] = hi_loc[i] - lo_loc[i] + increment[i];
        }
      }

      /* Get pointer to local data buffer and remote data
         buffer as well as lists of leading dimenstions */
      gam_LocationWithGhosts(me, handle, plo_snd, &ptr_snd, ld_loc);
#if GHOST_PRINT
      printf("p[%d] 1: plo_snd[0]: %d plo_snd[1]: %d ptr_snd: %d\n",
          GAme, plo_snd[0], plo_snd[1], (Integer)ptr_snd);
      fflush(stdout);
#endif
      gam_LocationWithGhosts(me, handle, plo_rcv, &ptr_rcv, ld_loc);
#if GHOST_PRINT
      printf("p[%d] 1: plo_rcv[0]: %d plo_rcv[1]: %d ptr_rcv: %d\n",
          GAme, plo_rcv[0], plo_rcv[1], (Integer)ptr_rcv);
      fflush(stdout);
#endif

      /* Evaluate strides for send and recieve */
      gam_setstride(ndim, size, ld_loc, ld_loc, stride_rcv,
          stride_snd);

      /* Compute the number of elements in each dimension and store
         result in count. Scale the first element in count by the
         element size. */
      gam_ComputeCount(ndim, plo_rcv, phi_rcv, count);
      gam_CountElems(ndim, plo_snd, phi_snd, &length);
      length *= size;
      count[0] *= size;

      /* Fill send buffer with data. */
#if GHOST_PRINT
      printf("p[%d]b 1: ptr_snd: %d ptr_rcv: %d\n", GAme, (Integer)ptr_snd,
              (Integer)ptr_rcv);
      printf("p[%d]b 1: length: %d proc_rem_snd: %d proc_rem_rcv: %d\n",
          GAme, (int)length, (int)proc_rem_snd, (int)proc_rem_rcv);
      printf("p[%d]b 1: count[0]: %d stride_rcv[0]: %d stride_rcv[1]: %d\n",
          GAme, count[0], stride_rcv[0],stride_rcv[1]);
      printf("p[%d]b 1: count[1]: %d stride_rcv[2]: %d stride_rcv[3]: %d\n",
          GAme, count[1], stride_rcv[2],stride_rcv[3]);
      printf("p[%d]b 1: count[2]: %d stride_snd[0]: %d stride_snd[1]: %d\n",
          GAme, count[2], stride_snd[0],stride_snd[1]);
      printf("p[%d]b 1: count[3]: %d stride_snd[2]: %d stride_snd[3]: %d\n",
          GAme, count[3], stride_snd[2],stride_snd[3]);
      printf("p[%d]b 1: snd_ptr: %d rcv_ptr: %d\n", GAme, (Integer)snd_ptr,
          (Integer)rcv_ptr);
      fflush(stdout);
#endif
      armci_write_strided(ptr_snd, (int)ndim-1, stride_snd, count, snd_ptr);

      /* Send Messages. If processor has odd index in direction idx, it
       * sends message first, if processor has even index it receives
       * message first. Then process is reversed. Also need to account
       * for whether or not there are an odd number of processors along
       * update direction. */

#if GHOST_PRINT
      printf("p[%d] 1: msgcnt: %d length: %d bufsize: %d proc_rem_snd: %d proc_rem_rcv: %d\n",
          GAme, msgcnt, length, bufsize, (int)proc_rem_snd, (int)proc_rem_rcv);
      fflush(stdout);
#endif
      snd_ptr = snd_ptr_orig;
      rcv_ptr = rcv_ptr_orig;
      if (GAme != proc_rem_snd) {
        if (GA[handle].nblock[idx]%2 == 0) {
          if (index[idx]%2 != 0) {
            armci_msg_snd(msgcnt, snd_ptr, length, proc_rem_snd);
          } else {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, proc_rem_rcv);
          }
          if (index[idx]%2 != 0) {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, proc_rem_rcv);
          } else {
            armci_msg_snd(msgcnt, snd_ptr, length, proc_rem_snd);
          }
        } else {
          pmax = GA[handle].nblock[idx] - 1;
          if (index[idx]%2 != 0) {
            armci_msg_snd(msgcnt, snd_ptr, length, proc_rem_snd);
          } else if (index[idx] != pmax) {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, proc_rem_rcv);
          }
          if (index[idx]%2 != 0) {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, proc_rem_rcv);
          } else if (index[idx] != 0) {
            armci_msg_snd(msgcnt, snd_ptr, length, proc_rem_snd);
          }
          /* make up for odd processor at end of string */
          if (index[idx] == 0) {
            armci_msg_snd(msgcnt, snd_ptr, length, proc_rem_snd);
          }
          if (index[idx] == pmax) {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, proc_rem_rcv);
          }
        }
      } else {
        rcv_ptr = snd_ptr;
      }
      msgcnt++;
      /* copy data back into global array */
      armci_read_strided(ptr_rcv, (int)ndim-1, stride_rcv, count, rcv_ptr);

      /* Find parameters for message in positive direction. */
      get_remote_block_pos(idx, ndim, lo_loc, hi_loc, slo_rcv, shi_rcv,
                           dims, width);
      /* locate processor with this data */
      if (!pnga_locate_region(g_a, slo_rcv, shi_rcv, _ga_map,
          _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
          slo_rcv, shi_rcv, g_a);
      proc_rem_snd = _ga_proclist[0];
      if (p_handle >= 0) {
        proc_rem_snd = PGRP_LIST[p_handle].inv_map_proc_list[proc_rem_snd];
      }

      /* Find processor from which data will be recieved */
      for (i = 0; i < ndim; i++) {
        if (i == idx) {
          lo_rcv[i] = lo_loc[i] - width[i];
          hi_rcv[i] = lo_loc[i] - 1;
        } else {
          lo_rcv[i] = lo_loc[i];
          hi_rcv[i] = hi_loc[i];
        }
      }

      /* Account for boundaries, if necessary. */
      for (i=0; i<ndim; i++) {
        if (i == idx) {
          if (hi_rcv[i] < 1) {
            slo_rcv[i] = dims[i] - width[i] + 1;
            shi_rcv[i] = dims[i];
          } else {
            slo_rcv[i] = lo_rcv[i];
            shi_rcv[i] = hi_rcv[i];
          }
        } else {
          slo_rcv[i] = lo_rcv[i];
          shi_rcv[i] = hi_rcv[i];
        }
      }
      /* locate processor with this data */
      if (!pnga_locate_region(g_a, slo_rcv, shi_rcv, _ga_map,
          _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
          slo_rcv, shi_rcv, g_a);
      proc_rem_rcv = _ga_proclist[0];
      if (p_handle >= 0) {
        proc_rem_rcv = PGRP_LIST[p_handle].inv_map_proc_list[proc_rem_rcv];
      }
      /* Get actual coordinates of chunk of data that will be sent to
       * remote processor as well as coordinates of the array space that
       * will receive data from remote processor. */
      for (i = 0; i < ndim; i++) {
        if (increment[i] == 0) {
          if (i == idx) {
            plo_snd[i] = hi_loc[i] - lo_loc[i] + 1;
            phi_snd[i] = hi_loc[i] - lo_loc[i] + width[i];
            plo_rcv[i] = 0;
            phi_rcv[i] = width[i] - 1;
          } else {
            plo_snd[i] = width[i];
            phi_snd[i] = hi_loc[i] - lo_loc[i] + width[i];
            plo_rcv[i] = width[i];
            phi_rcv[i] = hi_loc[i] - lo_loc[i] + width[i];
          }
        } else {
          plo_rcv[i] = 0;
          phi_rcv[i] = hi_loc[i] - lo_loc[i] + increment[i];
          plo_snd[i] = 0;
          phi_snd[i] = hi_loc[i] - lo_loc[i] + increment[i];
        }
      }

      /* Get pointer to local data buffer and remote data
         buffer as well as lists of leading dimenstions */
      gam_LocationWithGhosts(me, handle, plo_snd, &ptr_snd, ld_loc);
#if GHOST_PRINT
      printf("p[%d] 2: plo_snd[0]: %d plo_snd[1]: %d ptr_snd: %d\n",
          GAme, plo_snd[0], plo_snd[1], (Integer)ptr_snd);
      fflush(stdout);
#endif
      gam_LocationWithGhosts(me, handle, plo_rcv, &ptr_rcv, ld_loc);
#if GHOST_PRINT
      printf("p[%d] 2: plo_rcv[0]: %d plo_rcv[1]: %d ptr_rcv: %d\n",
          GAme, plo_rcv[0], plo_rcv[1], (Integer)ptr_rcv);
      fflush(stdout);
#endif

      /* Evaluate strides for send and recieve */
      gam_setstride(ndim, size, ld_loc, ld_loc, stride_rcv,
          stride_snd);

      /* Compute the number of elements in each dimension and store
         result in count. Scale the first element in count by the
         element size. */
      gam_ComputeCount(ndim, plo_rcv, phi_rcv, count);
      gam_CountElems(ndim, plo_snd, phi_snd, &length);
      length *= size;
      count[0] *= size;

      /* Need to reallocate memory if length > buflen */
      /* TO DO */

      /* Fill send buffer with data. */
#if GHOST_PRINT
      printf("p[%d]b 2: ptr_snd: %d ptr_rcv: %d\n", GAme, (Integer)ptr_snd,
              (Integer)ptr_rcv);
      printf("p[%d]b 2: length: %d proc_rem_snd: %d proc_rem_rcv: %d\n",
          GAme, (int)length, (int)proc_rem_snd, (int)proc_rem_rcv);
      printf("p[%d]b 2: count[0]: %d stride_rcv[0]: %d stride_rcv[1]: %d\n",
          GAme, count[0], stride_rcv[0],stride_rcv[1]);
      printf("p[%d]b 2: count[1]: %d stride_rcv[2]: %d stride_rcv[3]: %d\n",
          GAme, count[1], stride_rcv[2],stride_rcv[3]);
      printf("p[%d]b 2: count[2]: %d stride_snd[0]: %d stride_snd[1]: %d\n",
          GAme, count[2], stride_snd[0],stride_snd[1]);
      printf("p[%d]b 2: count[3]: %d stride_snd[2]: %d stride_snd[3]: %d\n",
          GAme, count[3], stride_snd[2],stride_snd[3]);
      printf("p[%d]b 2: snd_ptr: %d rcv_ptr: %d\n", GAme, (Integer)snd_ptr,
          (Integer)rcv_ptr);
      fflush(stdout);
#endif
      armci_write_strided(ptr_snd, (int)ndim-1, stride_snd, count, snd_ptr);

      /* Send Messages. If processor has odd index in direction idx, it
       * sends message first, if processor has even index it receives
       * message first. Then process is reversed. Also need to account
       * for whether or not there are an odd number of processors along
       * update direction. */

#if GHOST_PRINT
      printf("p[%d] 2: msgcnt: %d length: %d bufsize: %d proc_rem_snd: %d proc_rem_rcv: %d\n",
          GAme, msgcnt, length, bufsize, (int)proc_rem_snd, (int)proc_rem_rcv);
      fflush(stdout);
#endif
      snd_ptr = snd_ptr_orig;
      rcv_ptr = rcv_ptr_orig;
      if (GAme != proc_rem_rcv) {
        if (GA[handle].nblock[idx]%2 == 0) {
          if (index[idx]%2 != 0) {
            armci_msg_snd(msgcnt, snd_ptr, length, proc_rem_snd);
          } else {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, proc_rem_rcv);
          }
          if (index[idx]%2 != 0) {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, proc_rem_rcv);
          } else {
            armci_msg_snd(msgcnt, snd_ptr, length, proc_rem_snd);
          }
        } else {
          pmax = GA[handle].nblock[idx] - 1;
          if (index[idx]%2 != 0) {
            armci_msg_snd(msgcnt, snd_ptr, length, proc_rem_snd);
          } else if (index[idx] != 0) {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, proc_rem_rcv);
          }
          if (index[idx]%2 != 0) {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, proc_rem_rcv);
          } else if (index[idx] != pmax) {
            armci_msg_snd(msgcnt, snd_ptr, length, proc_rem_snd);
          }
          /* make up for odd processor at end of string */
          if (index[idx] == pmax) {
            armci_msg_snd(msgcnt, snd_ptr, length, proc_rem_snd);
          }
          if (index[idx] == 0) {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, proc_rem_rcv);
          }
        }
      } else {
        rcv_ptr = snd_ptr;
      }
      /* copy data back into global array */
      armci_read_strided(ptr_rcv, (int)ndim-1, stride_rcv, count, rcv_ptr);
      msgcnt++;
    }
    if (GA[handle].corner_flag)
      increment[idx] = 2*width[idx];
  }

  pnga_free(rcv_ptr_orig);
  pnga_free(snd_ptr_orig);
  free(_ga_map);
  free(_ga_proclist);
  return TRUE;
}